

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_3> *
tcu::operator*(Matrix<float,_4,_3> *__return_storage_ptr__,Matrix<float,_4,_4> *a,
              Matrix<float,_4,_3> *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int row_1;
  Vector<float,_4> *pVVar3;
  Matrix<float,_4,_3> *res;
  long lVar4;
  int row;
  long lVar5;
  long lVar6;
  float v;
  float fVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  long lVar9;
  
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[2].m_data[2] = 0.0;
  pVVar3[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[1].m_data[2] = 0.0;
  pVVar3[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  auVar2 = _DAT_00a99450;
  auVar1 = _DAT_00a99400;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar8 = auVar1;
    do {
      bVar10 = SUB164(auVar8 ^ auVar2,4) == -0x80000000 && SUB164(auVar8 ^ auVar2,0) < -0x7ffffffd;
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar4 != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar3 + -1))->m_data[0].m_data + lVar6) =
             uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar4 + -0x10 != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pVVar3->m_data + lVar6) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x10;
    pVVar3 = (Vector<float,_4> *)(pVVar3->m_data + 1);
  } while (lVar5 != 4);
  lVar4 = 0;
  do {
    lVar5 = 0;
    pVVar3 = (Vector<float,_4> *)b;
    do {
      fVar7 = 0.0;
      lVar6 = 0;
      do {
        fVar7 = fVar7 + *(float *)((long)a + lVar6 * 4) *
                        *(float *)((long)((Vector<tcu::Vector<float,_4>,_3> *)pVVar3->m_data)->
                                         m_data[0].m_data + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      (__return_storage_ptr__->m_data).m_data[lVar5].m_data[lVar4] = fVar7;
      lVar5 = lVar5 + 1;
      pVVar3 = pVVar3 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    a = (Matrix<float,_4,_4> *)((long)a + 4);
  } while (lVar4 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}